

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O3

uint32 __thiscall Clasp::ReduceParams::prepare(ReduceParams *this,bool withLookback)

{
  ReduceStrategy RVar1;
  undefined3 in_register_00000031;
  float fVar2;
  float fVar3;
  
  RVar1 = this->strategy;
  if ((CONCAT31(in_register_00000031,withLookback) == 0) ||
     ((fVar2 = (float)((uint)RVar1 >> 0xb & 0x7f) / 100.0, fVar2 == 0.0 && (!NAN(fVar2))))) {
    *(undefined8 *)&this->cflSched = 0;
    (this->cflSched).len = 0;
    (this->cflSched).grow = 1.5;
    *(undefined8 *)&this->growSched = 0;
    (this->growSched).len = 0;
    (this->growSched).grow = 1.5;
    this->strategy = (ReduceStrategy)((uint)RVar1 & 0xfffc07ff);
    this->fGrow = 0.0;
    this->fInit = 0.0;
    this->fMax = 0.0;
    (this->initRange).lo = 0xffffffff;
    (this->initRange).hi = 0xffffffff;
    this->maxRange = 0xffffffff;
    this->memMax = 0;
  }
  else {
    if ((*(int *)&this->cflSched == 0x40000000) &&
       (*(uint *)&this->growSched != 0x40000000 && (*(uint *)&this->growSched & 0x3fffffff) == 0)) {
      *(undefined8 *)&this->cflSched = 0x40000fa0;
      (this->cflSched).len = 0;
      (this->cflSched).grow = 600.0;
    }
    fVar2 = this->fMax;
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      fVar3 = this->fInit;
      if (this->fInit <= fVar2) {
        fVar3 = fVar2;
      }
      this->fMax = fVar3;
    }
  }
  return 0;
}

Assistant:

uint32 ReduceParams::prepare(bool withLookback) {
	if (!withLookback || fReduce() == 0.0f) {
		disable();
		return 0;
	}
	if (cflSched.defaulted() && growSched.disabled() && !growSched.defaulted()) {
		cflSched = ScheduleStrategy::arith(4000, 600);
	}
	if (fMax != 0.0f) { fMax = std::max(fMax, fInit); }
	return 0;
}